

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

quicly_stream_t * quicly_get_stream(quicly_conn_t *conn,quicly_stream_id_t stream_id)

{
  khint_t kVar1;
  khint64_t in_RSI;
  long in_RDI;
  khiter_t iter;
  undefined8 local_8;
  
  kVar1 = kh_get_quicly_stream_t(*(kh_quicly_stream_t_t **)(in_RDI + 0x548),in_RSI);
  if (kVar1 == **(khint_t **)(in_RDI + 0x548)) {
    local_8 = (quicly_stream_t *)0x0;
  }
  else {
    local_8 = *(quicly_stream_t **)(*(long *)(*(long *)(in_RDI + 0x548) + 0x20) + (ulong)kVar1 * 8);
  }
  return local_8;
}

Assistant:

quicly_stream_t *quicly_get_stream(quicly_conn_t *conn, quicly_stream_id_t stream_id)
{
    khiter_t iter = kh_get(quicly_stream_t, conn->streams, stream_id);
    if (iter != kh_end(conn->streams))
        return kh_val(conn->streams, iter);
    return NULL;
}